

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLoad.h
# Opt level: O0

int __thiscall chrono::ChLoad<MyLoaderTriangular>::LoadGet_ndof_w(ChLoad<MyLoaderTriangular> *this)

{
  int iVar1;
  element_type *peVar2;
  ChLoad<MyLoaderTriangular> *local_10;
  ChLoad<MyLoaderTriangular> *this_local;
  
  local_10 = this;
  ChLoaderU::GetLoadable((ChLoaderU *)&stack0xffffffffffffffe0);
  peVar2 = std::__shared_ptr_access<chrono::ChLoadable,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<chrono::ChLoadable,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&stack0xffffffffffffffe0);
  iVar1 = (**(code **)(*(long *)peVar2 + 0x18))();
  std::shared_ptr<chrono::ChLoadable>::~shared_ptr
            ((shared_ptr<chrono::ChLoadable> *)&stack0xffffffffffffffe0);
  return iVar1;
}

Assistant:

inline int ChLoad<Tloader>::LoadGet_ndof_w() {
    return this->loader.GetLoadable()->LoadableGet_ndof_w();
}